

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O3

void __thiscall Assimp::ObjFileParser::getMaterialDesc(ObjFileParser *this)

{
  byte *pbVar1;
  Model *pMVar2;
  mapped_type pMVar3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  iterator iVar8;
  Logger *this_00;
  long *plVar9;
  Material *pMVar10;
  mapped_type *ppMVar11;
  byte *pbVar12;
  long *plVar13;
  byte *pbVar14;
  size_t __n;
  string strName;
  key_type local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  undefined8 local_438;
  long local_430;
  long local_428;
  long lStack_420;
  
  pbVar14 = (byte *)(this->m_DataIt)._M_current;
  pbVar1 = (byte *)(this->m_DataItEnd)._M_current;
  pbVar12 = pbVar1 + -1;
  if (pbVar12 != pbVar14 && pbVar14 != pbVar1) {
    do {
      if (((ulong)*pbVar14 < 0x21) && ((0x100003601U >> ((ulong)*pbVar14 & 0x3f) & 1) != 0))
      goto LAB_00499100;
      pbVar14 = pbVar14 + 1;
    } while ((pbVar14 != pbVar1) && (pbVar14 != pbVar12));
  }
LAB_0049910d:
  (this->m_DataIt)._M_current = (char *)pbVar14;
  if (pbVar14 == pbVar1) {
    return;
  }
  do {
    if ((*pbVar14 < 0xe) && ((0x3401U >> (*pbVar14 & 0x1f) & 1) != 0)) break;
    pbVar14 = pbVar14 + 1;
    (this->m_DataIt)._M_current = (char *)pbVar14;
  } while (pbVar14 != pbVar1);
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_498);
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_478,local_498._M_dataplus._M_p,
             local_498._M_dataplus._M_p + local_498._M_string_length);
  trim_whitespaces<std::__cxx11::string>(&local_478);
  std::__cxx11::string::operator=((string *)&local_498,(string *)&local_438);
  if (local_438 != &local_428) {
    operator_delete(local_438,local_428 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  sVar4 = local_498._M_string_length;
  pMVar2 = (this->m_pModel)._M_t.
           super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
           ._M_t.
           super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
           .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
  pMVar10 = pMVar2->m_pCurrentMaterial;
  if (pMVar10 == (Material *)0x0) {
LAB_0049923c:
    if (sVar4 == 0) goto LAB_004993cc;
  }
  else {
    __n = 0x3ff;
    if ((local_498._M_string_length & 0xfffffc00) == 0) {
      __n = local_498._M_string_length & 0xffffffff;
    }
    local_438 = (long *)CONCAT44(local_438._4_4_,(int)__n);
    memcpy((void *)((long)&local_438 + 4),local_498._M_dataplus._M_p,__n);
    *(undefined1 *)((long)&local_438 + __n + 4) = 0;
    if ((pMVar10->MaterialName).length != (int)__n) goto LAB_0049923c;
    iVar6 = bcmp((pMVar10->MaterialName).data,(void *)((long)&local_438 + 4),__n);
    if (iVar6 == 0 || sVar4 == 0) goto LAB_004993cc;
  }
  iVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
          ::find(&(pMVar2->m_MaterialMap)._M_t,&local_498);
  pMVar2 = (this->m_pModel)._M_t.
           super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
           ._M_t.
           super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
           .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
  if (iVar8._M_node == (_Base_ptr)((long)&(pMVar2->m_MaterialMap)._M_t + 8U)) {
    this_00 = DefaultLogger::get();
    std::operator+(&local_458,"OBJ: failed to locate material ",&local_498);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_458);
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_428 = *plVar13;
      lStack_420 = plVar9[3];
      local_438 = &local_428;
    }
    else {
      local_428 = *plVar13;
      local_438 = (long *)*plVar9;
    }
    local_430 = plVar9[1];
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    Logger::error(this_00,(char *)local_438);
    if (local_438 != &local_428) {
      operator_delete(local_438,local_428 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
    }
    pMVar10 = (Material *)operator_new(0x409c);
    ObjFile::Material::Material(pMVar10);
    ((this->m_pModel)._M_t.
     super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>.
     _M_t.
     super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>.
     super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->m_pCurrentMaterial =
         pMVar10;
    if (local_498._M_string_length < 0x400) {
      pMVar10 = ((this->m_pModel)._M_t.
                 super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                 .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
                m_pCurrentMaterial;
      (pMVar10->MaterialName).length = (int)local_498._M_string_length;
      memcpy((pMVar10->MaterialName).data,local_498._M_dataplus._M_p,local_498._M_string_length);
      *(undefined1 *)((long)(pMVar10->MaterialName).data + local_498._M_string_length) = 0;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&((this->m_pModel)._M_t.
                  super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                  .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
                 m_MaterialLib,&local_498);
    pMVar2 = (this->m_pModel)._M_t.
             super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
             ._M_t.
             super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
             .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
    pMVar3 = pMVar2->m_pCurrentMaterial;
    ppMVar11 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
               ::operator[](&pMVar2->m_MaterialMap,&local_498);
    *ppMVar11 = pMVar3;
  }
  else {
    pMVar2->m_pCurrentMaterial = *(Material **)(iVar8._M_node + 2);
  }
  bVar5 = needsNewMesh(this,&local_498);
  if (bVar5) {
    createMesh(this,&local_498);
  }
  uVar7 = getMaterialIndex(this,&local_498);
  ((this->m_pModel)._M_t.
   super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>._M_t.
   super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>.
   super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->m_pCurrentMesh->
  m_uiMaterialIndex = uVar7;
LAB_004993cc:
  pbVar12 = (byte *)(this->m_DataIt)._M_current;
  pbVar14 = (byte *)(this->m_DataItEnd)._M_current;
  if (pbVar14 + -1 != pbVar12 && pbVar12 != pbVar14) {
    do {
      if (((*pbVar12 < 0xe) && ((0x3401U >> (*pbVar12 & 0x1f) & 1) != 0)) ||
         (pbVar12 = pbVar12 + 1, pbVar12 == pbVar14)) break;
    } while (pbVar12 != pbVar14 + -1);
  }
  pbVar1 = pbVar12;
  if (pbVar12 != pbVar14) {
    pbVar12 = pbVar12 + 1;
    this->m_uiLine = this->m_uiLine + 1;
    pbVar1 = pbVar12;
  }
  for (; (pbVar1 != pbVar14 && ((*pbVar1 == 0x20 || (pbVar12 = pbVar1, *pbVar1 == 9))));
      pbVar1 = pbVar1 + 1) {
    pbVar12 = pbVar14;
  }
  (this->m_DataIt)._M_current = (char *)pbVar12;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  return;
LAB_00499100:
  if ((*pbVar14 != 0x20) && (*pbVar14 != 9)) goto LAB_0049910d;
  pbVar14 = pbVar14 + 1;
  if ((pbVar14 == pbVar1) || (pbVar14 == pbVar12)) goto LAB_0049910d;
  goto LAB_00499100;
}

Assistant:

void ObjFileParser::getMaterialDesc() {
    // Get next data for material data
    m_DataIt = getNextToken<DataArrayIt>(m_DataIt, m_DataItEnd);
    if (m_DataIt == m_DataItEnd) {
        return;
    }

    char *pStart = &(*m_DataIt);
    while( m_DataIt != m_DataItEnd && !IsLineEnd( *m_DataIt ) ) {
        ++m_DataIt;
    }

    // In some cases we should ignore this 'usemtl' command, this variable helps us to do so
    bool skip = false;

    // Get name
    std::string strName(pStart, &(*m_DataIt));
    strName = trim_whitespaces(strName);
    if (strName.empty())
        skip = true;

    // If the current mesh has the same material, we simply ignore that 'usemtl' command
    // There is no need to create another object or even mesh here
    if ( m_pModel->m_pCurrentMaterial && m_pModel->m_pCurrentMaterial->MaterialName == aiString( strName ) ) {
        skip = true;
    }

    if (!skip) {
        // Search for material
        std::map<std::string, ObjFile::Material*>::iterator it = m_pModel->m_MaterialMap.find(strName);
        if (it == m_pModel->m_MaterialMap.end()) {
			// Not found, so we don't know anything about the material except for its name.
			// This may be the case if the material library is missing. We don't want to lose all
			// materials if that happens, so create a new named material instead of discarding it
			// completely.
            ASSIMP_LOG_ERROR("OBJ: failed to locate material " + strName + ", creating new material");
			m_pModel->m_pCurrentMaterial = new ObjFile::Material();
			m_pModel->m_pCurrentMaterial->MaterialName.Set(strName);
			m_pModel->m_MaterialLib.push_back(strName);
			m_pModel->m_MaterialMap[strName] = m_pModel->m_pCurrentMaterial;
        } else {
            // Found, using detected material
            m_pModel->m_pCurrentMaterial = (*it).second;
        }

        if ( needsNewMesh( strName ) ) {
            createMesh( strName );
        }

        m_pModel->m_pCurrentMesh->m_uiMaterialIndex = getMaterialIndex(strName);
    }

    // Skip rest of line
    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}